

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraints_with_arguments.cpp
# Opt level: O3

Am_Formula Am_From_Object(Am_Object *object,Am_Slot_Key key)

{
  Am_Wrapper *stored_data;
  undefined2 in_DX;
  Am_Formula_Data *extraout_RDX;
  undefined6 in_register_00000032;
  Am_Formula AVar1;
  Am_Object AStack_28;
  
  Am_Formula::Am_Formula((Am_Formula *)object,from_object_procedure,(char *)0x0);
  stored_data = (Am_Wrapper *)operator_new(0x20);
  Am_Object::Am_Object(&AStack_28,(Am_Object *)CONCAT62(in_register_00000032,key));
  stored_data->refs = 1;
  (stored_data->super_Am_Registered_Type)._vptr_Am_Registered_Type = (_func_int **)&PTR_ID_002e2a60;
  Am_Object::Am_Object((Am_Object *)(stored_data + 1),&AStack_28);
  *(undefined2 *)&stored_data[1].refs = in_DX;
  Am_Formula::Set_Data((Am_Formula *)object,stored_data);
  Am_Object::~Am_Object(&AStack_28);
  AVar1.data = extraout_RDX;
  AVar1.super_Am_Registered_Type._vptr_Am_Registered_Type = (_func_int **)object;
  return AVar1;
}

Assistant:

Am_Formula
Am_From_Object(Am_Object object, Am_Slot_Key key)
{
  Am_Formula formula(from_object_procedure, DSTR("Am_From_Object"));
  formula.Set_Data(new Object_Key_Store_Data(object, key));
  return formula;
}